

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

UniformBlock * __thiscall
deqp::gls::ub::ShaderInterface::allocBlock(ShaderInterface *this,char *name)

{
  size_type sVar1;
  UniformBlock *this_00;
  reference ppUVar2;
  vector<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_> *this_01;
  UniformBlock *local_20;
  char *local_18;
  char *name_local;
  ShaderInterface *this_local;
  
  this_01 = &this->m_uniformBlocks;
  local_18 = name;
  name_local = (char *)this;
  sVar1 = std::vector<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
          ::size(this_01);
  std::vector<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>::
  reserve(this_01,sVar1 + 1);
  this_00 = (UniformBlock *)operator_new(0x60);
  UniformBlock::UniformBlock(this_00,local_18);
  local_20 = this_00;
  std::vector<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>::
  push_back(this_01,&local_20);
  ppUVar2 = std::
            vector<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>::
            back(&this->m_uniformBlocks);
  return *ppUVar2;
}

Assistant:

UniformBlock& ShaderInterface::allocBlock (const char* name)
{
	m_uniformBlocks.reserve(m_uniformBlocks.size()+1);
	m_uniformBlocks.push_back(new UniformBlock(name));
	return *m_uniformBlocks.back();
}